

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
               (Nonzero<double> *keys,int end,IdxCompare *compare,int start,bool type)

{
  Nonzero<double> *pNVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int start_00;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int *piVar15;
  uint end_00;
  uint uVar16;
  
  uVar9 = (ulong)(uint)start;
  if (start + 1 < end) {
    end_00 = end - 1;
    uVar5 = end_00 - start;
    if (0x18 < (int)uVar5) {
LAB_001fa2d5:
      start_00 = (int)uVar9;
      iVar6 = (uVar5 >> 1) + start_00;
      pNVar1 = keys + iVar6;
      iVar6 = keys[iVar6].idx;
      lVar8 = (long)start_00;
      lVar7 = -(long)(int)end_00;
      uVar14 = uVar9;
      uVar5 = end_00;
      do {
        iVar12 = (int)uVar14;
        uVar11 = (ulong)uVar5;
        if ((type & 1U) == 0) {
          if (iVar12 < (int)end_00) {
            piVar15 = &keys[iVar12].idx;
            lVar13 = 0;
            do {
              bVar4 = EQ(*piVar15,iVar6);
              if ((!bVar4) && (iVar6 <= *piVar15)) {
                uVar16 = iVar12 - (int)lVar13;
                break;
              }
              lVar13 = lVar13 + -1;
              piVar15 = piVar15 + 4;
              uVar16 = end_00;
            } while (lVar7 + iVar12 != lVar13);
            uVar14 = (ulong)uVar16;
          }
          if (start_00 < (int)uVar5) {
            uVar10 = (ulong)(int)uVar5;
            piVar15 = &keys[uVar10].idx;
            do {
              bVar4 = EQ(*piVar15,iVar6);
              uVar11 = uVar10;
              if ((bVar4) || (*piVar15 < iVar6)) break;
              uVar10 = uVar10 - 1;
              piVar15 = piVar15 + -4;
              uVar11 = uVar9;
            } while (lVar8 < (long)uVar10);
          }
        }
        else {
          if (iVar12 < (int)end_00) {
            piVar15 = &keys[iVar12].idx;
            lVar13 = 0;
            do {
              bVar4 = EQ(*piVar15,iVar6);
              if ((bVar4) || (iVar6 <= *piVar15)) {
                uVar16 = iVar12 - (int)lVar13;
                break;
              }
              lVar13 = lVar13 + -1;
              piVar15 = piVar15 + 4;
              uVar16 = end_00;
            } while (lVar7 + iVar12 != lVar13);
            uVar14 = (ulong)uVar16;
          }
          if (start_00 < (int)uVar5) {
            uVar10 = (ulong)(int)uVar5;
            piVar15 = &keys[uVar10].idx;
            do {
              bVar4 = EQ(*piVar15,iVar6);
              if ((!bVar4) && (uVar11 = uVar10, *piVar15 < iVar6)) break;
              uVar10 = uVar10 - 1;
              piVar15 = piVar15 + -4;
              uVar11 = uVar9;
            } while (lVar8 < (long)uVar10);
          }
        }
        iVar12 = (int)uVar14;
        uVar5 = (uint)uVar11;
        if ((int)uVar5 <= iVar12) goto LAB_001fa4c4;
        dVar2 = keys[iVar12].val;
        iVar3 = keys[iVar12].idx;
        keys[iVar12].idx = keys[(int)uVar5].idx;
        keys[iVar12].val = keys[(int)uVar5].val;
        keys[(int)uVar5].val = dVar2;
        keys[(int)uVar5].idx = iVar3;
        uVar14 = (ulong)(iVar12 + 1);
        uVar5 = uVar5 - 1;
      } while( true );
    }
LAB_001fa655:
    if (0 < (int)uVar5) {
      SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
                (keys,end_00,compare,start);
      return;
    }
  }
  return;
LAB_001fa4c4:
  if ((type & 1U) == 0) {
    if (start_00 < (int)uVar5) {
      uVar10 = (ulong)(int)uVar5;
      piVar15 = &keys[uVar10].idx;
      do {
        bVar4 = EQ(iVar6,*piVar15);
        if ((!bVar4) && (uVar11 = uVar10, *piVar15 <= iVar6)) break;
        uVar10 = uVar10 - 1;
        piVar15 = piVar15 + -4;
        uVar11 = uVar9;
      } while (lVar8 < (long)uVar10);
    }
    uVar5 = (uint)uVar11;
    if (uVar5 == end_00) {
      dVar2 = keys[(int)uVar5].val;
      iVar6 = keys[(int)uVar5].idx;
      keys[(int)uVar5].idx = pNVar1->idx;
      keys[(int)uVar5].val = pNVar1->val;
      pNVar1->val = dVar2;
      pNVar1->idx = iVar6;
      uVar5 = uVar5 - 1;
    }
  }
  else {
    if (iVar12 < (int)end_00) {
      piVar15 = &keys[iVar12].idx;
      lVar7 = 0;
      do {
        bVar4 = EQ(iVar6,*piVar15);
        if ((!bVar4) && (iVar6 < *piVar15)) {
          uVar16 = iVar12 - (int)lVar7;
          break;
        }
        lVar7 = lVar7 + -1;
        piVar15 = piVar15 + 4;
        uVar16 = end_00;
      } while ((long)iVar12 - (long)(int)end_00 != lVar7);
      uVar14 = (ulong)uVar16;
    }
    iVar6 = (int)uVar14;
    if (iVar6 == start_00) {
      dVar2 = keys[iVar6].val;
      iVar12 = keys[iVar6].idx;
      keys[iVar6].idx = pNVar1->idx;
      keys[iVar6].val = pNVar1->val;
      pNVar1->val = dVar2;
      pNVar1->idx = iVar12;
      uVar14 = (ulong)(iVar6 + 1);
    }
  }
  iVar6 = (int)uVar14;
  if ((int)(end_00 - iVar6) < (int)(uVar5 - start_00)) {
    uVar14 = uVar9;
    uVar16 = uVar5;
    uVar5 = end_00;
    start_00 = iVar6;
    if ((int)end_00 <= iVar6) goto LAB_001fa634;
  }
  else {
    uVar9 = uVar14;
    uVar16 = end_00;
    if ((int)uVar5 <= start_00) goto LAB_001fa634;
  }
  SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
            (keys,uVar5 + 1,compare,start_00,(bool)(~type & 1));
  uVar9 = uVar14;
LAB_001fa634:
  end_00 = uVar16;
  type = (bool)(type ^ 1);
  start = (int)uVar9;
  uVar5 = end_00 - start;
  if ((int)uVar5 < 0x19) goto LAB_001fa655;
  goto LAB_001fa2d5;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}